

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Type> * __thiscall
wasm::IRBuilder::getLabelType
          (Result<wasm::Type> *__return_storage_ptr__,IRBuilder *this,Name labelName)

{
  undefined8 *puVar1;
  undefined1 local_90 [8];
  Result<unsigned_int> label;
  Result<unsigned_int> _val;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  getLabelIndex((Result<unsigned_int> *)local_90,this,labelName,false);
  std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
             ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_90);
  if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
               label.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
               _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ +
               label.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ == &local_30) {
      *puVar1 = CONCAT71(uStack_2f,local_30);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) = uStack_28;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> =
           _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
           CONCAT71(uStack_2f,local_30);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) = local_38;
    local_30 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
    _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &local_30;
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
               ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
               ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    getLabelType(__return_storage_ptr__,this,local_90._0_4_);
  }
  std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Result<Type> IRBuilder::getLabelType(Name labelName) {
  auto label = getLabelIndex(labelName);
  CHECK_ERR(label);
  return getLabelType(*label);
}